

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

bool __thiscall
QScrollerPrivate::scrollingSegmentsValid(QScrollerPrivate *this,Orientation orientation)

{
  double dVar1;
  double p;
  int iVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  qreal qVar7;
  double dVar8;
  
  bVar6 = orientation != Horizontal;
  lVar5 = 0x100;
  if (!bVar6) {
    lVar5 = 0xe8;
  }
  lVar4 = *(long *)((long)&this->target + lVar5);
  if (lVar4 == 0) {
    return true;
  }
  lVar4 = lVar4 * 0x40;
  iVar2 = *(int *)(*(long *)(&this->field_0x8 + lVar5) + -8 + lVar4);
  if (iVar2 == 1) {
    return true;
  }
  dVar1 = (&(this->contentPosRange).xp)[bVar6];
  dVar8 = (&(this->contentPosRange).w)[bVar6] + dVar1;
  p = *(double *)(*(long *)(&this->field_0x8 + lVar5) + -0x10 + lVar4);
  if (iVar2 == 2) {
    if ((p != dVar1) || (NAN(p) || NAN(dVar1))) {
      if ((p != dVar8) || (NAN(p) || NAN(dVar8))) {
        return false;
      }
    }
  }
  bVar6 = false;
  if ((dVar1 <= p) && (p <= dVar8)) {
    if ((p == dVar1) && (!NAN(p) && !NAN(dVar1))) {
      return true;
    }
    bVar6 = true;
    if ((p != dVar8) || (NAN(p) || NAN(dVar8))) {
      qVar7 = nextSnapPos(this,p,0,orientation);
      bVar3 = qIsNaN(qVar7);
      return (bool)(p == qVar7 | bVar3);
    }
  }
  return bVar6;
}

Assistant:

bool QScrollerPrivate::scrollingSegmentsValid(Qt::Orientation orientation) const
{
    const QQueue<ScrollSegment> *segments;
    qreal minPos;
    qreal maxPos;

    if (orientation == Qt::Horizontal) {
        segments = &xSegments;
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
    } else {
        segments = &ySegments;
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
    }

    if (segments->isEmpty())
        return true;

    const ScrollSegment &last = segments->last();
    qreal stopPos = last.stopPos;

    if (last.type == ScrollTypeScrollTo)
        return true; // scrollTo is always valid

    if (last.type == ScrollTypeOvershoot &&
        (stopPos != minPos && stopPos != maxPos))
        return false;

    if (stopPos < minPos || stopPos > maxPos)
        return false;

    if (stopPos == minPos || stopPos == maxPos) // the begin and the end of the list are always ok
        return true;

    qreal nextSnap = nextSnapPos(stopPos, 0, orientation);
    if (!qIsNaN(nextSnap) && stopPos != nextSnap)
        return false;

    return true;
}